

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteEscapedString(BinaryWriterSpec *this,string_view s)

{
  byte c;
  size_t i;
  size_type sVar1;
  
  Stream::WriteU8(this->json_stream_,0x22,(char *)0x0,No);
  for (sVar1 = 0; s.size_ != sVar1; sVar1 = sVar1 + 1) {
    c = s.data_[sVar1];
    if (((c < 0x20) || (c == 0x5c)) || (c == 0x22)) {
      Stream::Writef(this->json_stream_,"\\u%04x");
    }
    else {
      Stream::WriteChar(this->json_stream_,c,(char *)0x0,No);
    }
  }
  Stream::WriteU8(this->json_stream_,0x22,(char *)0x0,No);
  return;
}

Assistant:

void BinaryWriterSpec::WriteEscapedString(string_view s) {
  json_stream_->WriteChar('"');
  for (size_t i = 0; i < s.length(); ++i) {
    uint8_t c = s[i];
    if (c < 0x20 || c == '\\' || c == '"') {
      json_stream_->Writef("\\u%04x", c);
    } else {
      json_stream_->WriteChar(c);
    }
  }
  json_stream_->WriteChar('"');
}